

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

Iterator aom_vector_begin(Vector *vector)

{
  Iterator IVar1;
  
  if ((vector != (Vector *)0x0) && (vector->element_size != 0)) {
    IVar1.element_size = vector->element_size;
    IVar1.pointer = vector->data;
    return IVar1;
  }
  return (Iterator)ZEXT816(0);
}

Assistant:

Iterator aom_vector_iterator(Vector *vector, size_t index) {
  Iterator iterator = { NULL, 0 };

  assert(vector != NULL);
  assert(index <= vector->size);

  if (vector == NULL) return iterator;
  if (index > vector->size) return iterator;
  if (vector->element_size == 0) return iterator;

  iterator.pointer = _vector_offset(vector, index);
  iterator.element_size = vector->element_size;

  return iterator;
}